

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O0

void __thiscall
InterpreterTestSuite_PC_Sessionid_Test::TestBody(InterpreterTestSuite_PC_Sessionid_Test *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  bool bVar1;
  element_type *this_01;
  MockSpec<ot::commissioner::Error_(unsigned_short_&)> *this_02;
  TypedExpectation<ot::commissioner::Error_(unsigned_short_&)> *this_03;
  char *pcVar2;
  char *in_R9;
  string local_338;
  AssertHelper local_318;
  Message local_310;
  bool local_301;
  undefined1 local_300 [8];
  AssertionResult gtest_ar_;
  allocator local_2a1;
  string local_2a0;
  Expression local_280;
  Error local_268;
  ReturnAction<ot::commissioner::Error> local_240;
  anon_class_1_0_00000001_for_action local_22a;
  testing local_229;
  DoAllAction<testing::internal::WithArgsAction<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_openthread[P]ot_commissioner_src_app_cli_interpreter_test_cpp:1716:36),_0UL>,_testing::internal::ReturnAction<ot::commissioner::Error>_>
  local_228;
  Action<ot::commissioner::Error_(unsigned_short_&)> local_210;
  WithoutMatchers local_1e9;
  Matcher<unsigned_short_&> local_1e8;
  MockSpec<ot::commissioner::Error_(unsigned_short_&)> local_1d0;
  undefined1 local_1b0 [8];
  Value value;
  Expression expr;
  undefined1 local_140 [8];
  TestContext ctx;
  InterpreterTestSuite_PC_Sessionid_Test *this_local;
  
  ctx.mCommissionerAppStaticExpecter.gmock02_Create_150.super_UntypedFunctionMockerBase.
  untyped_expectations_.
  super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  InterpreterTestSuite::TestContext::TestContext((TestContext *)local_140);
  InterpreterTestSuite::InitContext(&this->super_InterpreterTestSuite,(TestContext *)local_140);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&value.mData.field_2 + 8));
  ot::commissioner::Interpreter::Value::Value((Value *)local_1b0);
  this_01 = std::__shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator*((__shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&ctx.mRegistry);
  testing::internal::AnythingMatcher::operator_cast_to_Matcher
            (&local_1e8,(AnythingMatcher *)&testing::_);
  CommissionerAppMock::gmock_GetSessionId(&local_1d0,this_01,&local_1e8);
  testing::internal::GetWithoutMatchers();
  this_02 = testing::internal::MockSpec<ot::commissioner::Error_(unsigned_short_&)>::operator()
                      (&local_1d0,&local_1e9,(void *)0x0);
  pcVar2 = "*ctx.mDefaultCommissionerObject";
  this_03 = testing::internal::MockSpec<ot::commissioner::Error_(unsigned_short_&)>::
            InternalExpectedAt(this_02,
                               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                               ,0x6b3,"*ctx.mDefaultCommissionerObject","GetSessionId(_)");
  testing::WithArg<0ul,InterpreterTestSuite_PC_Sessionid_Test::TestBody()::__0>(&local_22a);
  ot::commissioner::Error::Error(&local_268);
  testing::Return<ot::commissioner::Error>((testing *)&local_240,&local_268);
  testing::
  DoAll<testing::internal::WithArgsAction<InterpreterTestSuite_PC_Sessionid_Test::TestBody()::__0,0ul>,testing::internal::ReturnAction<ot::commissioner::Error>>
            (&local_228,&local_229,
             (WithArgsAction<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_openthread[P]ot_commissioner_src_app_cli_interpreter_test_cpp:1716:36),_0UL>
              *)&local_240,(ReturnAction<ot::commissioner::Error> *)pcVar2);
  testing::internal::DoAllAction::operator_cast_to_Action(&local_210,(DoAllAction *)&local_228);
  testing::internal::TypedExpectation<ot::commissioner::Error_(unsigned_short_&)>::WillOnce
            (this_03,&local_210);
  testing::Action<ot::commissioner::Error_(unsigned_short_&)>::~Action(&local_210);
  testing::internal::
  DoAllAction<testing::internal::WithArgsAction<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp:1716:36),_0UL>,_testing::internal::ReturnAction<ot::commissioner::Error>_>
  ::~DoAllAction(&local_228);
  testing::internal::ReturnAction<ot::commissioner::Error>::~ReturnAction(&local_240);
  ot::commissioner::Error::~Error(&local_268);
  testing::internal::MockSpec<ot::commissioner::Error_(unsigned_short_&)>::~MockSpec(&local_1d0);
  testing::Matcher<unsigned_short_&>::~Matcher(&local_1e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2a0,"sessionid",&local_2a1);
  ot::commissioner::Interpreter::ParseExpression(&local_280,(Interpreter *)local_140,&local_2a0);
  this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&value.mData.field_2 + 8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(this_00,&local_280);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_280);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
  ot::commissioner::Interpreter::Eval((Value *)&gtest_ar_.message_,(Interpreter *)local_140,this_00)
  ;
  ot::commissioner::Interpreter::Value::operator=((Value *)local_1b0,(Value *)&gtest_ar_.message_);
  ot::commissioner::Interpreter::Value::~Value((Value *)&gtest_ar_.message_);
  local_301 = ot::commissioner::Interpreter::Value::HasNoError((Value *)local_1b0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_300,&local_301,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_300);
  if (!bVar1) {
    testing::Message::Message(&local_310);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_338,(internal *)local_300,(AssertionResult *)0x46a487,"false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_318,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x6b7,pcVar2);
    testing::internal::AssertHelper::operator=(&local_318,&local_310);
    testing::internal::AssertHelper::~AssertHelper(&local_318);
    std::__cxx11::string::~string((string *)&local_338);
    testing::Message::~Message(&local_310);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_300);
  ot::commissioner::Interpreter::Value::~Value((Value *)local_1b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&value.mData.field_2 + 8));
  InterpreterTestSuite::TestContext::~TestContext((TestContext *)local_140);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, PC_Sessionid)
{
    TestContext ctx;
    InitContext(ctx);

    Interpreter::Expression expr;
    Interpreter::Value      value;

    EXPECT_CALL(*ctx.mDefaultCommissionerObject, GetSessionId(_))
        .WillOnce(DoAll(WithArg<0>([=](uint16_t &a) { a = 1; }), Return(Error{})));
    expr  = ctx.mInterpreter.ParseExpression("sessionid");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());
}